

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_warp_piecewise_linear.c
# Opt level: O0

float fe_warp_piecewise_linear_unwarped_to_warped(float linear)

{
  undefined4 local_14;
  float temp;
  float linear_local;
  
  temp = linear;
  if (is_neutral == 0) {
    if (params[1] <= linear) {
      local_14 = final_piece[0] * linear + final_piece[1];
    }
    else {
      local_14 = linear * params[0];
    }
    temp = local_14;
  }
  return temp;
}

Assistant:

float
fe_warp_piecewise_linear_unwarped_to_warped(float linear)
{
    if (is_neutral) {
        return linear;
    }
    else {
        float temp;
        /* nonlinear = a * linear - b */
        if (linear < params[1]) {
            temp = linear * params[0];
        }
        else {
            temp = final_piece[0] * linear + final_piece[1];
        }
        return temp;
    }
}